

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O3

RK_S32 mpp_av1_lr_params(AV1Context *ctx,BitReadCtx_t *gb,AV1RawFrameHeader *current)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  AV1RawSequenceHeader *pAVar4;
  RK_S32 RVar5;
  RK_S32 RVar6;
  long lVar7;
  RK_U32 value;
  RK_U8 local_3c [4];
  AV1RawSequenceHeader *local_38;
  
  RVar6 = 0;
  RVar5 = 0;
  if ((((ctx->all_lossless == 0) && (RVar5 = RVar6, current->allow_intrabc == '\0')) &&
      (local_38 = ctx->sequence_header, local_38->enable_restoration != '\0')) &&
     (0 < ctx->num_planes)) {
    lVar7 = 0;
    bVar2 = false;
    bVar1 = false;
    do {
      RVar5 = mpp_av1_read_unsigned(gb,2,"lr_type[i]",(RK_U32 *)local_3c,0,3);
      pAVar4 = local_38;
      if (RVar5 < 0) goto LAB_001c4404;
      bVar3 = bVar2;
      if (local_3c[0] != '\0') {
        bVar1 = true;
        bVar3 = true;
      }
      if (lVar7 != 0) {
        bVar2 = bVar3;
      }
      current->lr_type[lVar7] = local_3c[0];
      lVar7 = lVar7 + 1;
    } while (lVar7 < ctx->num_planes);
    RVar5 = 0;
    if (bVar1) {
      RVar5 = mpp_av1_read_increment
                        (gb,(uint)(local_38->use_128x128_superblock != '\0'),2,"lr_unit_shift",
                         (RK_U32 *)local_3c);
      if (-1 < RVar5) {
        current->lr_unit_shift = local_3c[0];
        if ((((pAVar4->color_config).subsampling_x == '\0') ||
            ((pAVar4->color_config).subsampling_y == '\0')) || (!bVar2)) {
          current->lr_uv_shift = '\0';
          return 0;
        }
        RVar5 = mpp_av1_read_unsigned(gb,1,"lr_uv_shift",(RK_U32 *)local_3c,0,1);
        if (-1 < RVar5) {
          current->lr_uv_shift = local_3c[0];
          return 0;
        }
      }
LAB_001c4404:
      RVar5 = -1;
    }
  }
  return RVar5;
}

Assistant:

static RK_S32 mpp_av1_lr_params(AV1Context *ctx, BitReadCtx_t *gb,
                                AV1RawFrameHeader *current)
{
    const AV1RawSequenceHeader *seq = ctx->sequence_header;
    RK_S32 uses_lr,  uses_chroma_lr;
    RK_S32 i, err;

    if (ctx->all_lossless || current->allow_intrabc ||
        !seq->enable_restoration) {
        return 0;
    }

    uses_lr = uses_chroma_lr = 0;
    for (i = 0; i < ctx->num_planes; i++) {
        fbs(2, lr_type[i], 1, i);

        if (current->lr_type[i] != AV1_RESTORE_NONE) {
            uses_lr = 1;
            if (i > 0)
                uses_chroma_lr = 1;
        }
    }

    if (uses_lr) {
        if (seq->use_128x128_superblock)
            increment(lr_unit_shift, 1, 2);
        else
            increment(lr_unit_shift, 0, 2);

        if (seq->color_config.subsampling_x &&
            seq->color_config.subsampling_y && uses_chroma_lr) {
            fb(1, lr_uv_shift);
        } else {
            infer(lr_uv_shift, 0);
        }
    }

    return 0;
}